

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer2.c
# Opt level: O2

ktx_error_code_e ktxTexture2_DeflateZstd(ktxTexture2 *This,ktx_uint32_t compressionLevel)

{
  ktx_uint32_t kVar1;
  ktxTexture2_private *pkVar2;
  uint uVar3;
  ZSTD_ErrorCode ZVar4;
  ZSTD_CCtx *cctx;
  size_t sVar5;
  void *__ptr;
  ulong uVar6;
  ktx_uint8_t *__dest;
  uint uVar7;
  ktx_error_code_e kVar8;
  ulong __n;
  size_t dstCapacity;
  ktxLevelIndexEntry *__dest_00;
  long lVar9;
  size_t __size;
  ktx_uint32_t kVar10;
  long lVar11;
  
  kVar1 = This->numLevels;
  pkVar2 = This->_private;
  cctx = ZSTD_createCCtx();
  if (cctx != (ZSTD_CCtx *)0x0) {
    if (This->supercompressionScheme != KTX_SS_BEGIN_RANGE) {
      return KTX_INVALID_OPERATION;
    }
    __dest_00 = pkVar2->_levelIndex;
    kVar10 = This->numLevels;
    dstCapacity = 0;
    while (kVar10 = kVar10 - 1, -1 < (int)kVar10) {
      sVar5 = ZSTD_compressBound(pkVar2->_levelIndex[kVar10 & 0x7fffffff].byteLength);
      dstCapacity = dstCapacity + sVar5;
    }
    __n = (ulong)(kVar1 * 0x18);
    __ptr = malloc(__n + dstCapacity);
    if (__ptr == (void *)0x0) {
LAB_0024ce18:
      kVar8 = KTX_OUT_OF_MEMORY;
LAB_0024ce1b:
      ZSTD_freeCCtx(cctx);
      free(__ptr);
      return kVar8;
    }
    uVar7 = This->numLevels;
    lVar9 = 0;
    __size = 0;
    while (uVar7 = uVar7 - 1, -1 < (int)uVar7) {
      uVar6 = (ulong)(uVar7 & 0x7fffffff);
      lVar11 = uVar6 * 0x18;
      sVar5 = ZSTD_compressCCtx(cctx,(void *)((long)((long)__ptr + __n) + lVar9),dstCapacity,
                                This->pData + __dest_00[uVar6].byteOffset,
                                pkVar2->_levelIndex[uVar6].byteLength,compressionLevel);
      uVar3 = ZSTD_isError(sVar5);
      if (uVar3 != 0) {
        free(__ptr);
        ZVar4 = ZSTD_getErrorCode(sVar5);
        if (ZVar4 == ZSTD_error_parameter_outOfBound) {
          kVar8 = KTX_INVALID_VALUE;
        }
        else {
          if (ZVar4 == ZSTD_error_memory_allocation) goto LAB_0024ce18;
          kVar8 = KTX_OUT_OF_MEMORY;
          if ((ZVar4 != ZSTD_error_workSpace_tooSmall) && (ZVar4 != ZSTD_error_dstSize_tooSmall)) {
            kVar8 = KTX_INVALID_OPERATION;
          }
        }
        goto LAB_0024ce1b;
      }
      *(long *)((long)__ptr + lVar11) = lVar9;
      *(ktx_uint64_t *)((long)__ptr + lVar11 + 0x10) = __dest_00[uVar6].byteLength;
      *(size_t *)((long)__ptr + lVar11 + 8) = sVar5;
      __size = __size + sVar5;
      lVar9 = lVar9 + sVar5;
      dstCapacity = dstCapacity - sVar5;
    }
    ZSTD_freeCCtx(cctx);
    __dest = (ktx_uint8_t *)malloc(__size);
    if (__dest != (ktx_uint8_t *)0x0) {
      memcpy(__dest,(void *)((long)__ptr + __n),__size);
      memcpy(__dest_00,__ptr,__n);
      free(__ptr);
      free(This->pData);
      This->pData = __dest;
      This->dataSize = __size;
      This->supercompressionScheme = KTX_SS_ZSTD;
      This->_private->_requiredLevelAlignment = 1;
      return KTX_SUCCESS;
    }
    free(__ptr);
  }
  return KTX_OUT_OF_MEMORY;
}

Assistant:

KTX_error_code
ktxTexture2_DeflateZstd(ktxTexture2* This, ktx_uint32_t compressionLevel)
{
    ktx_uint32_t levelIndexByteLength =
                            This->numLevels * sizeof(ktxLevelIndexEntry);
    ktx_uint8_t* workBuf;
    ktx_uint8_t* cmpData;
    ktx_size_t dstRemainingByteLength = 0;
    ktx_size_t byteLengthCmp = 0;
    ktx_size_t levelOffset = 0;
    ktxLevelIndexEntry* cindex = This->_private->_levelIndex;
    ktxLevelIndexEntry* nindex;
    ktx_uint8_t* pCmpDst;
    ktx_error_code_e result;

    ZSTD_CCtx* cctx = ZSTD_createCCtx();
    if (cctx == NULL)
        return KTX_OUT_OF_MEMORY;

    if (This->supercompressionScheme != KTX_SS_NONE)
        return KTX_INVALID_OPERATION;

    // On rare occasions the deflated data can be a few bytes larger than
    // the source data. Calculating the dst buffer size using
    // ZSTD_compressBound provides a suitable size plus compression is said
    // to run faster when the dst buffer is >= compressBound.
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        dstRemainingByteLength += ZSTD_compressBound(cindex[level].byteLength);
    }

    workBuf = malloc(dstRemainingByteLength + levelIndexByteLength);
    if (workBuf == NULL) {
        result = KTX_OUT_OF_MEMORY;
        goto cleanup;
    }
    nindex = (ktxLevelIndexEntry*)workBuf;
    pCmpDst = &workBuf[levelIndexByteLength];

    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        size_t levelByteLengthCmp =
            ZSTD_compressCCtx(cctx, pCmpDst + levelOffset,
                              dstRemainingByteLength,
                              &This->pData[cindex[level].byteOffset],
                              cindex[level].byteLength,
                              compressionLevel);
        if (ZSTD_isError(levelByteLengthCmp)) {
            free(workBuf);
            ZSTD_ErrorCode error = ZSTD_getErrorCode(levelByteLengthCmp);
            switch(error) {
              case ZSTD_error_parameter_outOfBound:
                result = KTX_INVALID_VALUE;
                goto cleanup;
              case ZSTD_error_dstSize_tooSmall:
#ifdef DEBUG
                assert(false && "Deflate dstSize too small.");
#else
                result = KTX_OUT_OF_MEMORY;
                goto cleanup;
#endif
              case ZSTD_error_workSpace_tooSmall:
#ifdef DEBUG
                assert(false && "Deflate workspace too small.");
#else
                result = KTX_OUT_OF_MEMORY;
                goto cleanup;
#endif
              case ZSTD_error_memory_allocation:
                result = KTX_OUT_OF_MEMORY;
                goto cleanup;
              default:
                // The remaining errors look like they should only
                // occur during decompression but just in case.
#ifdef DEBUG
                assert(true);
#else
                result = KTX_INVALID_OPERATION;
                goto cleanup;
#endif
            }
        }
        nindex[level].byteOffset = levelOffset;
        nindex[level].uncompressedByteLength = cindex[level].byteLength;
        nindex[level].byteLength = levelByteLengthCmp;
        byteLengthCmp += levelByteLengthCmp;
        levelOffset += levelByteLengthCmp;
        dstRemainingByteLength -= levelByteLengthCmp;
    }
    ZSTD_freeCCtx(cctx);

    // Move the compressed data into a correctly sized buffer.
    cmpData = malloc(byteLengthCmp);
    if (cmpData == NULL) {
        free(workBuf);
        return KTX_OUT_OF_MEMORY;
    }
    // Now modify the texture.
    memcpy(cmpData, pCmpDst, byteLengthCmp); // Copy data to sized buffer.
    memcpy(cindex, nindex, levelIndexByteLength); // Update level index
    free(workBuf);
    free(This->pData);
    This->pData = cmpData;
    This->dataSize = byteLengthCmp;
    This->supercompressionScheme = KTX_SS_ZSTD;
    This->_private->_requiredLevelAlignment = 1;

    return KTX_SUCCESS;

cleanup:
    ZSTD_freeCCtx(cctx);
    free(workBuf);
    return result;
}